

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marginal.cc
# Opt level: O1

void MARGINAL::predict_or_learn<false>(data *sm,single_learner *base,example *ec)

{
  byte bVar1;
  long lVar2;
  features *pfVar3;
  undefined8 *puVar4;
  features *pfVar5;
  features *pfVar6;
  byte *pbVar7;
  byte bVar8;
  undefined8 local_80 [12];
  float local_20;
  
  bVar8 = 0;
  make_marginal<false>(sm,ec);
  (**(code **)(base + 0x30))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec);
  if (sm->compete == true) {
    sm->feature_pred = (ec->pred).scalar;
    compute_expert_loss<false>(sm,ec);
  }
  pbVar7 = (ec->super_example_predict).indices._begin;
  if (pbVar7 != (ec->super_example_predict).indices._end) {
    do {
      bVar1 = *pbVar7;
      if (sm->id_features[bVar1] == true) {
        pfVar6 = (ec->super_example_predict).feature_space + bVar1;
        pfVar3 = sm->temp + bVar1;
        puVar4 = local_80;
        for (lVar2 = 0xd; lVar2 != 0; lVar2 = lVar2 + -1) {
          *puVar4 = (pfVar3->values)._begin;
          pfVar3 = (features *)((long)pfVar3 + (ulong)bVar8 * -0x10 + 8);
          puVar4 = puVar4 + (ulong)bVar8 * -2 + 1;
        }
        pfVar3 = pfVar6;
        pfVar5 = sm->temp + bVar1;
        for (lVar2 = 0xc; lVar2 != 0; lVar2 = lVar2 + -1) {
          (pfVar5->values)._begin = (pfVar3->values)._begin;
          pfVar3 = (features *)((long)pfVar3 + ((ulong)bVar8 * -2 + 1) * 8);
          pfVar5 = (features *)((long)pfVar5 + (ulong)bVar8 * -0x10 + 8);
        }
        sm->temp[bVar1].sum_feat_sq = (ec->super_example_predict).feature_space[bVar1].sum_feat_sq;
        puVar4 = local_80;
        for (lVar2 = 0xc; lVar2 != 0; lVar2 = lVar2 + -1) {
          (pfVar6->values)._begin = (float *)*puVar4;
          puVar4 = puVar4 + (ulong)bVar8 * -2 + 1;
          pfVar6 = (features *)((long)pfVar6 + ((ulong)bVar8 * -2 + 1) * 8);
        }
        (ec->super_example_predict).feature_space[bVar1].sum_feat_sq = local_20;
      }
      pbVar7 = pbVar7 + 1;
    } while (pbVar7 != (ec->super_example_predict).indices._end);
  }
  return;
}

Assistant:

void predict_or_learn(data& sm, LEARNER::single_learner& base, example& ec)
{
  make_marginal<is_learn>(sm, ec);
  if (is_learn)
    if (sm.update_before_learn)
    {
      base.predict(ec);
      float pred = ec.pred.scalar;
      if (sm.compete)
      {
        sm.feature_pred = pred;
        compute_expert_loss<is_learn>(sm, ec);
      }
      undo_marginal(sm, ec);
      update_marginal(sm, ec);  // update features before learning.
      make_marginal<is_learn>(sm, ec);
      base.learn(ec);
      ec.pred.scalar = pred;
    }
    else
    {
      base.learn(ec);
      if (sm.compete)
      {
        sm.feature_pred = ec.pred.scalar;
        compute_expert_loss<is_learn>(sm, ec);
      }
      update_marginal(sm, ec);
    }
  else
  {
    base.predict(ec);
    float pred = ec.pred.scalar;
    if (sm.compete)
    {
      sm.feature_pred = pred;
      compute_expert_loss<is_learn>(sm, ec);
    }
  }

  // undo marginalization
  undo_marginal(sm, ec);
}